

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntheticData.cpp
# Opt level: O2

MatrixXd *
GeneratePointsOnSphereSurface
          (MatrixXd *__return_storage_ptr__,int samples,Vector3d *center,double radius,double noise)

{
  pointer pMVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong i;
  double dVar5;
  double dVar6;
  result_type rVar7;
  double dVar8;
  double dVar9;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  temp;
  double local_a60;
  double local_a58;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_a50;
  normal_distribution<double> normal;
  mt19937_64 rng;
  
  temp.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  temp.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  temp.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = 0;
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&rng,0);
  normal._M_param._M_mean = 0.0;
  normal._M_saved = 0.0;
  normal._M_saved_available = false;
  iVar2 = samples;
  if (samples < 1) {
    iVar2 = 0;
  }
  normal._M_param._M_stddev = noise;
  for (; iVar2 != iVar3; iVar3 = iVar3 + 1) {
    dVar8 = (double)iVar3 * (2.0 / (double)samples) + -1.0 + (2.0 / (double)samples) * 0.5;
    dVar5 = 1.0 - dVar8 * dVar8;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar9 = (double)iVar3 * 2.399963229728653;
    dVar6 = cos(dVar9);
    dVar9 = sin(dVar9);
    dVar6 = dVar6 * dVar5 * radius +
            (center->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[0];
    dVar8 = dVar8 * radius +
            (center->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[1];
    dVar5 = dVar9 * dVar5 * radius +
            (center->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[2];
    if ((((long)ABS(dVar6) < 0x7ff0000000000000) && ((long)ABS(dVar8) < 0x7ff0000000000000)) &&
       ((long)ABS(dVar5) < 0x7ff0000000000000)) {
      rVar7 = std::normal_distribution<double>::operator()(&normal,&rng);
      local_a50.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)(dVar6 + rVar7);
      rVar7 = std::normal_distribution<double>::operator()(&normal,&rng);
      local_a58 = dVar8 + rVar7;
      rVar7 = std::normal_distribution<double>::operator()(&normal,&rng);
      local_a60 = dVar5 + rVar7;
      std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
      emplace_back<double,double,double>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&temp,(double *)&local_a50,&local_a58,&local_a60);
    }
  }
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,3,
             ((long)temp.
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)temp.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  uVar4 = 0;
  while( true ) {
    pMVar1 = temp.
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    i = (ulong)uVar4;
    if ((ulong)(((long)temp.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)temp.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= i) break;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              (&local_a50,__return_storage_ptr__,i);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
              (&local_a50,pMVar1 + i);
    uVar4 = uVar4 + 1;
  }
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&temp.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd
GeneratePointsOnSphereSurface(
	const int samples,
	const Eigen::Vector3d center,
	const double radius,
	const double noise)
{
	std::vector<Eigen::Vector3d> temp;

	std::mt19937_64 rng(0);
	std::normal_distribution<double> normal(0, noise);

	const auto offset = 2. / samples;
	const auto increment = M_PI * (3. - sqrt(5.));

	for (int i = 0, k = 0; i < samples; i++) {
		const auto y = ((i * offset) - 1) + (offset / 2);
		const auto r = sqrt(1 - y*y);
		const auto phi = i * increment;
		const auto x = cos(phi) * r;
		const auto z = sin(phi) * r;
		const auto xx = x * radius + center[0];
		const auto yy = y * radius + center[1];
		const auto zz = z * radius + center[2];
		if (std::isfinite(xx) && std::isfinite(yy) && std::isfinite(zz)) {
			temp.emplace_back(xx + normal(rng), yy + normal(rng), zz + normal(rng));
		}
	}

	Eigen::MatrixXd out;
	out.resize(3, temp.size());
	for (unsigned int i = 0; i < temp.size(); i++) {
		out.col(i) = temp[i];
	}

	return out;
}